

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O1

int stlest_(double *y,int *n,int *len,int *ideg,double *xs,double *ys,int *nleft,int *nright,
           double *w,int *userw,double *rw,int *ok)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  iVar1 = *n;
  dVar8 = pmax(*xs - (double)*nleft,(double)*nright - *xs);
  iVar3 = *len - *n;
  if (iVar3 != 0 && *n <= *len) {
    dVar8 = dVar8 + (double)(iVar3 / 2);
  }
  uVar2 = *nright;
  iVar3 = *nleft;
  dVar10 = 0.0;
  if (iVar3 <= (int)uVar2) {
    lVar7 = 0;
    do {
      dVar11 = ABS((double)(iVar3 + (int)lVar7) - *xs);
      if (dVar11 <= dVar8 * 0.999) {
        dVar9 = 1.0;
        if (dVar8 * 0.001 < dVar11) {
          dVar11 = dVar11 / dVar8;
          dVar9 = 1.0 - dVar11 * dVar11 * dVar11;
          dVar9 = dVar9 * dVar9 * dVar9;
        }
        w[(long)iVar3 + lVar7 + -1] = dVar9;
        if (*userw != 0) {
          w[(long)iVar3 + lVar7 + -1] = rw[(long)iVar3 + lVar7 + -1] * w[(long)iVar3 + lVar7 + -1];
        }
        dVar10 = dVar10 + w[(long)iVar3 + lVar7 + -1];
      }
      else {
        w[(long)iVar3 + lVar7 + -1] = 0.0;
      }
      lVar7 = lVar7 + 1;
    } while (~uVar2 + iVar3 + (int)lVar7 != 0);
  }
  if (dVar10 <= 0.0) {
    *ok = 0;
  }
  else {
    *ok = 1;
    iVar3 = *nright;
    iVar4 = *nleft;
    if (iVar4 <= iVar3) {
      lVar7 = -1;
      do {
        w[iVar4 + lVar7] = w[iVar4 + lVar7] / dVar10;
        lVar7 = lVar7 + 1;
      } while (iVar3 - iVar4 != (int)lVar7);
    }
    if ((0.0 < dVar8) && (0 < *ideg)) {
      dVar10 = 0.0;
      dVar8 = 0.0;
      if (iVar4 <= iVar3) {
        pdVar5 = w + (long)iVar4 + -1;
        iVar6 = iVar4;
        do {
          dVar8 = dVar8 + (double)iVar6 * *pdVar5;
          iVar6 = iVar6 + 1;
          pdVar5 = pdVar5 + 1;
        } while (iVar3 + 1 != iVar6);
      }
      if (iVar4 <= iVar3) {
        pdVar5 = w + (long)iVar4 + -1;
        dVar10 = 0.0;
        do {
          dVar10 = dVar10 + ((double)iVar4 - dVar8) * ((double)iVar4 - dVar8) * *pdVar5;
          pdVar5 = pdVar5 + 1;
          iVar4 = iVar4 + 1;
        } while (iVar3 + 1 != iVar4);
      }
      dVar11 = *xs;
      if (dVar10 < 0.0) {
        dVar9 = sqrt(dVar10);
      }
      else {
        dVar9 = SQRT(dVar10);
      }
      if (((double)iVar1 + -1.0) * 0.001 < dVar9) {
        iVar1 = *nright;
        iVar3 = *nleft;
        if (iVar3 <= iVar1) {
          pdVar5 = w + (long)iVar3 + -1;
          do {
            *pdVar5 = (((double)iVar3 - dVar8) * ((dVar11 - dVar8) / dVar10) + 1.0) * *pdVar5;
            pdVar5 = pdVar5 + 1;
            iVar3 = iVar3 + 1;
          } while (iVar1 + 1 != iVar3);
        }
      }
    }
    *ys = 0.0;
    iVar1 = *nright;
    iVar3 = *nleft;
    if (iVar3 <= iVar1) {
      dVar8 = *ys;
      lVar7 = -1;
      do {
        dVar8 = dVar8 + w[iVar3 + lVar7] * y[iVar3 + lVar7];
        *ys = dVar8;
        lVar7 = lVar7 + 1;
      } while (iVar1 - iVar3 != (int)lVar7);
    }
  }
  return 0;
}

Assistant:

int stlest_(double *y, int *n, int *len, int *ideg, double *xs, double *ys, int *nleft, int *
	nright, double *w, int *userw, double *rw, int *ok)
{
    /* System generated locals */
    int i__1;
    double d__1, d__2;


    /* Local variables */
    double a, b, c__, h__;
    int j;
    double r__, h1, h9, range;

/* Arg */
/* Var */
    /* Parameter adjustments */
    --rw;
    --w;
    --y;

    /* Function Body */
    range = (double) (*n) - 1.;
/* Computing MAX */
    d__1 = *xs - (double) (*nleft), d__2 = (double) (*nright) - *xs;
    h__ = pmax(d__1,d__2);
    if (*len > *n) {
	h__ += (double) ((*len - *n) / 2);
    }
    h9 = h__ * .999;
    h1 = h__ * .001;
    a = 0.0;
    i__1 = *nright;
    for (j = *nleft; j <= i__1; ++j) {
	r__ = (d__1 = (double) j - *xs, fabs(d__1));
	if (r__ <= h9) {
	    if (r__ <= h1) {
		w[j] = 1.0;
	    } else {
/* Computing 3rd power */
		d__2 = r__ / h__;
/* Computing 3rd power */
		d__1 = 1.f - d__2 * (d__2 * d__2);
		w[j] = d__1 * (d__1 * d__1);
	    }
	    if (*userw) {
		w[j] = rw[j] * w[j];
	    }
	    a += w[j];
	} else {
	    w[j] = 0.0;
	}
/* L60: */
    }
    if (a <= 0.0) {
	*ok = 0;
    } else {
	*ok = 1;
	i__1 = *nright;
	for (j = *nleft; j <= i__1; ++j) {
	    w[j] /= a;
/* L69: */
	}
	if (h__ > 0.f && *ideg > 0) {
	    a = 0.f;
	    i__1 = *nright;
	    for (j = *nleft; j <= i__1; ++j) {
		a += w[j] * (double) j;
/* L73: */
	    }
	    b = *xs - a;
	    c__ = 0.0;
	    i__1 = *nright;
	    for (j = *nleft; j <= i__1; ++j) {
/* Computing 2nd power */
		d__1 = (double) j - a;
		c__ += w[j] * (d__1 * d__1);
/* L75: */
	    }
	    if (sqrt(c__) > range * .001) {
		b /= c__;
		i__1 = *nright;
		for (j = *nleft; j <= i__1; ++j) {
		    w[j] *= b * ((double) j - a) + 1.0;
/* L79: */
		}
	    }
	}
	*ys = 0.0;
	i__1 = *nright;
	for (j = *nleft; j <= i__1; ++j) {
	    *ys += w[j] * y[j];
/* L81: */
	}
    }
    return 0;
}